

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cavity.c
# Opt level: O3

REF_STATUS
ref_cavity_find_face_with_side
          (REF_CAVITY ref_cavity,REF_INT node0,REF_INT node1,REF_INT *found_face)

{
  int iVar1;
  REF_DBL *pRVar2;
  uint uVar3;
  int *in_RAX;
  int iVar4;
  REF_INT RVar5;
  long lVar6;
  
  *found_face = -1;
  iVar4 = ref_cavity->maxface;
  if (0 < iVar4) {
    in_RAX = ref_cavity->f2n + 2;
    RVar5 = -1;
    lVar6 = 0;
    do {
      iVar1 = in_RAX[-2];
      if ((iVar1 != -1) &&
         (((in_RAX[-1] == node1 && iVar1 == node0 || (*in_RAX == node1 && in_RAX[-1] == node0)) ||
          (iVar1 == node1 && *in_RAX == node0)))) {
        if (RVar5 != -1) {
          if (ref_cavity->debug != 0) {
            pRVar2 = ref_cavity->ref_grid->node->real;
            lVar6 = (long)(node0 * 0xf);
            printf("at node0 %f %f %f\n",pRVar2[lVar6],pRVar2[lVar6 + 1],pRVar2[lVar6 + 2]);
            pRVar2 = ref_cavity->ref_grid->node->real;
            lVar6 = (long)(node1 * 0xf);
            uVar3 = printf("at node1 %f %f %f\n",pRVar2[lVar6],pRVar2[lVar6 + 1],pRVar2[lVar6 + 2]);
            in_RAX = (int *)(ulong)uVar3;
          }
          ref_cavity->state = REF_CAVITY_INCONSISTENT;
          *found_face = -1;
          break;
        }
        RVar5 = (REF_INT)lVar6;
        *found_face = RVar5;
        iVar4 = ref_cavity->maxface;
      }
      lVar6 = lVar6 + 1;
      in_RAX = in_RAX + 3;
    } while (lVar6 < iVar4);
  }
  return (REF_STATUS)in_RAX;
}

Assistant:

REF_FCN static REF_STATUS ref_cavity_find_face_with_side(REF_CAVITY ref_cavity,
                                                         REF_INT node0,
                                                         REF_INT node1,
                                                         REF_INT *found_face) {
  REF_INT face;

  *found_face = REF_EMPTY;

  each_ref_cavity_valid_face(ref_cavity, face) {
    if ((node0 == ref_cavity_f2n(ref_cavity, 0, face) &&
         node1 == ref_cavity_f2n(ref_cavity, 1, face)) ||
        (node0 == ref_cavity_f2n(ref_cavity, 1, face) &&
         node1 == ref_cavity_f2n(ref_cavity, 2, face)) ||
        (node0 == ref_cavity_f2n(ref_cavity, 2, face) &&
         node1 == ref_cavity_f2n(ref_cavity, 0, face))) {
      if (REF_EMPTY != *found_face) { /* found face twice */
        if (ref_cavity_debug(ref_cavity)) {
          printf("at node0 %f %f %f\n",
                 ref_node_xyz(ref_grid_node(ref_cavity_grid(ref_cavity)), 0,
                              node0),
                 ref_node_xyz(ref_grid_node(ref_cavity_grid(ref_cavity)), 1,
                              node0),
                 ref_node_xyz(ref_grid_node(ref_cavity_grid(ref_cavity)), 2,
                              node0));
          printf("at node1 %f %f %f\n",
                 ref_node_xyz(ref_grid_node(ref_cavity_grid(ref_cavity)), 0,
                              node1),
                 ref_node_xyz(ref_grid_node(ref_cavity_grid(ref_cavity)), 1,
                              node1),
                 ref_node_xyz(ref_grid_node(ref_cavity_grid(ref_cavity)), 2,
                              node1));
        }
        ref_cavity_state(ref_cavity) = REF_CAVITY_INCONSISTENT;
        *found_face = REF_EMPTY;
        return REF_SUCCESS;
      }
      *found_face = face;
    }
  }

  return REF_SUCCESS;
}